

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

cmListFileContext * __thiscall cmListFileBacktrace::Top(cmListFileBacktrace *this)

{
  bool bVar1;
  element_type *peVar2;
  cmListFileBacktrace *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (!bVar1) {
    __assert_fail("this->TopEntry",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListFileCache.cxx"
                  ,0x187,"const cmListFileContext &cmListFileBacktrace::Top() const");
  }
  peVar2 = std::
           __shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  bVar1 = Entry::IsBottom(peVar2);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->TopEntry->IsBottom()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListFileCache.cxx"
                  ,0x188,"const cmListFileContext &cmListFileBacktrace::Top() const");
  }
  peVar2 = std::
           __shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  return (cmListFileContext *)peVar2;
}

Assistant:

cmListFileContext const& cmListFileBacktrace::Top() const
{
  assert(this->TopEntry);
  assert(!this->TopEntry->IsBottom());
  return this->TopEntry->Context;
}